

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS
ref_node_tri_grad_nodes(REF_NODE ref_node,REF_INT *nodes,REF_DBL *scalar,REF_DBL *gradient)

{
  REF_DBL RVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  REF_DBL *pRVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  REF_DBL norm01 [3];
  REF_DBL norm02 [3];
  REF_DBL edge01 [3];
  REF_DBL edge02 [3];
  double local_90;
  REF_DBL grad2 [3];
  REF_DBL grad1 [3];
  
  *gradient = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;
  uVar8 = ref_node_tri_area(ref_node,nodes,&local_90);
  if (uVar8 == 0) {
    dVar14 = local_90 + local_90;
    iVar3 = nodes[1];
    pRVar6 = ref_node->real;
    iVar4 = *nodes;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      edge01[lVar11] = pRVar6[iVar3 * 0xf + lVar11] - pRVar6[iVar4 * 0xf + lVar11];
    }
    iVar3 = nodes[2];
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      edge02[lVar11] = pRVar6[iVar3 * 0xf + lVar11] - pRVar6[iVar4 * 0xf + lVar11];
    }
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      norm01[lVar11] = edge01[lVar11];
    }
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      norm02[lVar11] = edge02[lVar11];
    }
    uVar8 = ref_math_normalize(norm01);
    if (uVar8 == 0) {
      uVar8 = ref_math_normalize(norm02);
      if (uVar8 == 0) {
        for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
          grad1[lVar11] =
               norm02[lVar11] *
               -(norm02[2] * edge01[2] + norm02[0] * edge01[0] + norm02[1] * edge01[1]) +
               edge01[lVar11];
        }
        uVar8 = ref_math_normalize(grad1);
        if (uVar8 == 0) {
          for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
            grad1[lVar11] =
                 grad1[lVar11] *
                 SQRT(edge02[2] * edge02[2] + edge02[0] * edge02[0] + edge02[1] * edge02[1]);
          }
          for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
            grad2[lVar11] =
                 norm01[lVar11] *
                 -(edge02[2] * norm01[2] + edge02[0] * norm01[0] + edge02[1] * norm01[1]) +
                 edge02[lVar11];
          }
          uVar8 = ref_math_normalize(grad2);
          if (uVar8 == 0) {
            for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
              grad2[lVar11] =
                   grad2[lVar11] *
                   SQRT(edge01[2] * edge01[2] + edge01[0] * edge01[0] + edge01[1] * edge01[1]);
            }
            iVar3 = nodes[1];
            iVar4 = *nodes;
            iVar5 = nodes[2];
            for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
              gradient[lVar11] =
                   (scalar[iVar3] - scalar[iVar4]) * grad1[lVar11] +
                   (scalar[iVar5] - scalar[iVar4]) * grad2[lVar11];
            }
            auVar16._0_8_ = dVar14 * 1e+20;
            RVar1 = *gradient;
            auVar16._8_8_ = RVar1;
            auVar17._8_8_ = -RVar1;
            auVar17._0_8_ = -auVar16._0_8_;
            auVar17 = maxpd(auVar16,auVar17);
            dVar15 = auVar17._0_8_;
            if (auVar17._8_8_ < dVar15) {
              dVar2 = gradient[1];
              dVar18 = dVar2;
              if (dVar2 <= -dVar2) {
                dVar18 = -dVar2;
              }
              if (dVar18 < dVar15) {
                dVar18 = gradient[2];
                dVar19 = dVar18;
                if (dVar18 <= -dVar18) {
                  dVar19 = -dVar18;
                }
                if (dVar19 < dVar15) {
                  auVar13._8_8_ = dVar2;
                  auVar13._0_8_ = RVar1;
                  auVar7._8_8_ = dVar14;
                  auVar7._0_8_ = dVar14;
                  auVar17 = divpd(auVar13,auVar7);
                  *(undefined1 (*) [16])gradient = auVar17;
                  gradient[2] = dVar18 / dVar14;
                  return 0;
                }
              }
            }
            *gradient = 0.0;
            gradient[1] = 0.0;
            gradient[2] = 0.0;
            return 4;
          }
          uVar10 = (ulong)uVar8;
          pcVar12 = "normalize zero length grad2";
          uVar9 = 0xcea;
        }
        else {
          uVar10 = (ulong)uVar8;
          pcVar12 = "normalize zero length grad1";
          uVar9 = 0xce4;
        }
      }
      else {
        uVar10 = (ulong)uVar8;
        pcVar12 = "normalize zero length n0 -> n2";
        uVar9 = 0xcdf;
      }
    }
    else {
      uVar10 = (ulong)uVar8;
      pcVar12 = "normalize zero length n0 -> n1";
      uVar9 = 0xcde;
    }
  }
  else {
    uVar10 = (ulong)uVar8;
    pcVar12 = "area";
    uVar9 = 0xcd2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar9,
         "ref_node_tri_grad_nodes",uVar10,pcVar12);
  return (REF_STATUS)uVar10;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_grad_nodes(REF_NODE ref_node, REF_INT *nodes,
                                           REF_DBL *scalar, REF_DBL *gradient) {
  REF_DBL area2, dot, side_length;
  REF_DBL grad1[3], grad2[3], edge02[3], edge01[3], norm02[3], norm01[3];
  REF_INT i;
  gradient[0] = 0.0;
  gradient[1] = 0.0;
  gradient[2] = 0.0;

  RSS(ref_node_tri_area(ref_node, nodes, &area2), "area");
  area2 *= 2;

  for (i = 0; i < 3; i++)
    edge01[i] = ref_node_xyz(ref_node, i, nodes[1]) -
                ref_node_xyz(ref_node, i, nodes[0]);
  for (i = 0; i < 3; i++)
    edge02[i] = ref_node_xyz(ref_node, i, nodes[2]) -
                ref_node_xyz(ref_node, i, nodes[0]);

  for (i = 0; i < 3; i++) norm01[i] = edge01[i];
  for (i = 0; i < 3; i++) norm02[i] = edge02[i];
  RSS(ref_math_normalize(norm01), "normalize zero length n0 -> n1");
  RSS(ref_math_normalize(norm02), "normalize zero length n0 -> n2");

  dot = ref_math_dot(edge01, norm02);
  side_length = sqrt(ref_math_dot(edge02, edge02));
  for (i = 0; i < 3; i++) grad1[i] = edge01[i] - dot * norm02[i];
  RSS(ref_math_normalize(grad1), "normalize zero length grad1");
  for (i = 0; i < 3; i++) grad1[i] *= side_length;

  dot = ref_math_dot(edge02, norm01);
  side_length = sqrt(ref_math_dot(edge01, edge01));
  for (i = 0; i < 3; i++) grad2[i] = edge02[i] - dot * norm01[i];
  RSS(ref_math_normalize(grad2), "normalize zero length grad2");
  for (i = 0; i < 3; i++) grad2[i] *= side_length;

  for (i = 0; i < 3; i++)
    gradient[i] = (scalar[nodes[1]] - scalar[nodes[0]]) * grad1[i] +
                  (scalar[nodes[2]] - scalar[nodes[0]]) * grad2[i];

  if (ref_math_divisible(gradient[0], area2) &&
      ref_math_divisible(gradient[1], area2) &&
      ref_math_divisible(gradient[2], area2)) {
    gradient[0] /= area2;
    gradient[1] /= area2;
    gradient[2] /= area2;
  } else {
    gradient[0] = 0.0;
    gradient[1] = 0.0;
    gradient[2] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}